

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_runsingle(Curl_multi *multi,timeval now,Curl_easy *data)

{
  byte bVar1;
  curl_off_t cVar2;
  char *pcVar3;
  Curl_do_more_func p_Var4;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var5;
  Curl_easy *pCVar6;
  curl_llist_element *pcVar7;
  timeval now_00;
  timeval now_01;
  timeval now_02;
  timeval now_03;
  timeval newer;
  timeval newer_00;
  timeval newer_01;
  timeval now_04;
  _Bool _Var8;
  CURLcode status;
  CURLcode CVar9;
  uint uVar10;
  CURLcode CVar11;
  int iVar12;
  CURLMcode CVar13;
  connectdata *pcVar14;
  time_t tVar15;
  Curl_dns_entry *pCVar16;
  long lVar17;
  long lVar18;
  CURLMstate CVar19;
  followtype type;
  connectdata **ppcVar20;
  int iVar21;
  bool bVar22;
  _Bool protocol_connect;
  _Bool dophase_done;
  _Bool done;
  _Bool async_1;
  connectdata **local_80;
  char *newurl;
  _Bool async;
  _Bool connected;
  _Bool local_6d;
  int control;
  timeval now_local;
  
  now_local.tv_usec = now.tv_usec;
  now_local.tv_sec = now.tv_sec;
  protocol_connect = false;
  dophase_done = false;
  done = false;
  CVar13 = CURLM_BAD_EASY_HANDLE;
  if ((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) {
    ppcVar20 = &data->easy_conn;
    status = CURLE_OK;
    local_80 = ppcVar20;
LAB_0057fa72:
    do {
      if ((data->state).pipe_broke == true) {
        iVar21 = 0;
        Curl_infof(data,"Pipe broke: handle %p, url = %s\n",data,(data->state).path);
        if (data->mstate < CURLM_STATE_COMPLETED) {
          mstate(data,CURLM_STATE_CONNECT);
          status = CURLE_OK;
          iVar21 = -1;
        }
        (data->state).pipe_broke = false;
        data->easy_conn = (connectdata *)0x0;
        goto LAB_00580895;
      }
      pcVar14 = *ppcVar20;
      if ((pcVar14 == (connectdata *)0x0) && (data->mstate - CURLM_STATE_WAITRESOLVE < 0xd)) {
        Curl_failf(data,"In state %d with no easy_conn, bail out!\n");
        return CURLM_INTERNAL_ERROR;
      }
      _Var8 = multi->recheckstate;
      multi->recheckstate = false;
      if (_Var8 == true) {
        Curl_multi_process_pending_handles(multi);
        pcVar14 = *ppcVar20;
      }
      CVar19 = data->mstate;
      if (pcVar14 != (connectdata *)0x0) {
        if (CVar19 - CURLM_STATE_WAITRESOLVE < 0xe) {
          pcVar14->data = data;
        }
        else if (0xe < CVar19 - CURLM_STATE_CONNECT) goto LAB_0057fb33;
        tVar15 = Curl_timeleft(data,&now_local,CVar19 < CURLM_STATE_DO);
        CVar19 = data->mstate;
        if (-1 < tVar15) goto LAB_0057fb33;
        if (CVar19 == CURLM_STATE_WAITCONNECT) {
          newer_00.tv_usec = now_local.tv_usec;
          newer_00.tv_sec = now_local.tv_sec;
          tVar15 = curlx_tvdiff(newer_00,(data->progress).t_startsingle);
          Curl_failf(data,"Connection timed out after %ld milliseconds",tVar15);
        }
        else if (CVar19 == CURLM_STATE_WAITRESOLVE) {
          newer.tv_usec = now_local.tv_usec;
          newer.tv_sec = now_local.tv_sec;
          tVar15 = curlx_tvdiff(newer,(data->progress).t_startsingle);
          Curl_failf(data,"Resolving timed out after %ld milliseconds",tVar15);
        }
        else {
          lVar17 = (data->req).size;
          newer_01.tv_usec = now_local.tv_usec;
          newer_01.tv_sec = now_local.tv_sec;
          tVar15 = curlx_tvdiff(newer_01,(data->progress).t_startsingle);
          cVar2 = (data->req).bytecount;
          if (lVar17 == -1) {
            Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                       tVar15,cVar2);
          }
          else {
            Curl_failf(data,
                       "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                       ,tVar15,cVar2,(data->req).size);
          }
        }
        bVar22 = CURLM_STATE_DO < data->mstate;
        if (bVar22) {
          Curl_conncontrol(*ppcVar20,2);
        }
        status = CURLE_OPERATION_TIMEDOUT;
        multi_done(ppcVar20,CURLE_OPERATION_TIMEDOUT,true);
        goto LAB_00580777;
      }
LAB_0057fb33:
      iVar21 = 0;
      switch(CVar19) {
      case CURLM_STATE_INIT:
        status = Curl_pretransfer(data);
        if (status != CURLE_OK) goto LAB_00580186;
        mstate(data,CURLM_STATE_CONNECT);
        Curl_pgrsTime(data,TIMER_STARTOP);
LAB_0058078a:
        status = CURLE_OK;
        goto LAB_0058078c;
      case CURLM_STATE_CONNECT_PEND:
switchD_0057fb4f_caseD_1:
        iVar21 = 0;
        bVar22 = false;
        break;
      case CURLM_STATE_CONNECT:
        Curl_pgrsTime(data,TIMER_STARTSINGLE);
        status = Curl_connect(data,ppcVar20,&async,&protocol_connect);
        if (status != CURLE_OK) {
          if (status == CURLE_NO_CONNECTION_AVAILABLE) {
            mstate(data,CURLM_STATE_CONNECT_PEND);
            Curl_llist_insert_next(&multi->pending,(multi->pending).tail,data,&data->connect_queue);
            goto LAB_00580772;
          }
          goto switchD_0057fb4f_caseD_1;
        }
        status = Curl_add_handle_to_pipeline(data,data->easy_conn);
        if (status == CURLE_OK) {
          if (async != true) {
            if (protocol_connect == true) goto LAB_005801fb;
            if ((*ppcVar20)->tunnel_state[0] == TUNNEL_CONNECT) goto LAB_0057fe13;
            CVar19 = CURLM_STATE_WAITCONNECT;
            goto LAB_00580782;
          }
          CVar19 = CURLM_STATE_WAITRESOLVE;
          goto LAB_0058076c;
        }
LAB_0057ff63:
        bVar22 = true;
        iVar21 = 0;
        break;
      case CURLM_STATE_WAITRESOLVE:
        pcVar14 = *ppcVar20;
        lVar17 = 0x160;
        if (((pcVar14->bits).httpproxy == false) &&
           (lVar17 = 0xd8, (pcVar14->bits).conn_to_host != false)) {
          lVar17 = 0x100;
        }
        pcVar3 = *(char **)((pcVar14->chunk).hexbuffer + lVar17 + -0x20);
        pCVar16 = Curl_fetch_addr(pcVar14,pcVar3,(int)pcVar14->port);
        if (pCVar16 != (Curl_dns_entry *)0x0) {
          Curl_infof(data,"Hostname \'%s\' was found in DNS cache\n",pcVar3);
          singlesocket(multi,data);
          if (protocol_connect == true) {
LAB_005801fb:
            CVar19 = (CURLMstate)multi->pipelining & CURLM_STATE_CONNECT_PEND ^ CURLM_STATE_DO;
          }
          else if ((*ppcVar20)->tunnel_state[0] == TUNNEL_CONNECT) {
LAB_0057fe13:
            CVar19 = CURLM_STATE_WAITPROXYCONNECT;
          }
          else {
            CVar19 = CURLM_STATE_WAITCONNECT;
          }
LAB_00580782:
          mstate(data,CVar19);
          goto LAB_0058078a;
        }
        singlesocket(multi,data);
        bVar22 = true;
        status = CURLE_COULDNT_RESOLVE_HOST;
        break;
      case CURLM_STATE_WAITCONNECT:
        status = Curl_is_connected(*ppcVar20,0,&connected);
        if ((status == CURLE_OK & connected) == 1) {
          pcVar14 = *ppcVar20;
          if ((((pcVar14->http_proxy).proxytype == CURLPROXY_HTTPS) &&
              ((pcVar14->bits).proxy_ssl_connected[0] != true)) ||
             (pcVar14->tunnel_state[0] == TUNNEL_CONNECT)) {
            CVar19 = CURLM_STATE_WAITPROXYCONNECT;
            goto LAB_0058076c;
          }
          bVar1 = (pcVar14->bits).tunnel_proxy;
          iVar21 = 6;
LAB_005803a7:
          CVar19 = iVar21 - (uint)bVar1;
          goto LAB_00580782;
        }
        bVar22 = status != CURLE_OK;
        break;
      case CURLM_STATE_WAITPROXYCONNECT:
        status = Curl_http_connect(*ppcVar20,&protocol_connect);
        pcVar14 = *ppcVar20;
        if ((pcVar14->bits).proxy_connect_closed == true) {
          multi_done(ppcVar20,CURLE_OK,false);
          CVar19 = CURLM_STATE_CONNECT;
LAB_0057fe7e:
          mstate(data,CVar19);
          goto LAB_0058078a;
        }
        if (status == CURLE_OK) {
          if ((pcVar14->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar22 = false;
            status = CURLE_OK;
            iVar21 = 0;
            if ((pcVar14->bits).proxy_ssl_connected[0] != true) break;
          }
          bVar22 = false;
          status = CURLE_OK;
          iVar21 = 0;
          if (pcVar14->tunnel_state[0] != TUNNEL_CONNECT) {
            CVar19 = CURLM_STATE_SENDPROTOCONNECT;
            goto LAB_00580782;
          }
          break;
        }
        goto LAB_00580186;
      case CURLM_STATE_SENDPROTOCONNECT:
        status = Curl_protocol_connect(*ppcVar20,&protocol_connect);
        if (protocol_connect != false) {
          if (status == CURLE_OK) goto LAB_005801fb;
LAB_0057feac:
          Curl_posttransfer(data);
          _Var8 = true;
LAB_0057ff5e:
          multi_done(ppcVar20,status,_Var8);
          goto LAB_0057ff63;
        }
        mstate(data,CURLM_STATE_PROTOCONNECT);
        goto LAB_00580186;
      case CURLM_STATE_PROTOCONNECT:
        status = Curl_protocol_connecting(*ppcVar20,&protocol_connect);
        if (status != CURLE_OK) goto LAB_0057feac;
        bVar22 = false;
        status = CURLE_OK;
        iVar21 = 0;
        if (protocol_connect == true) goto LAB_005801fb;
        break;
      case CURLM_STATE_WAITDO:
        _Var8 = Curl_pipeline_checkget_write(data,data->easy_conn);
        bVar22 = false;
        if (_Var8) {
          CVar19 = CURLM_STATE_DO;
          goto LAB_0058004e;
        }
        goto LAB_00580777;
      case CURLM_STATE_DO:
        pcVar14 = data->easy_conn;
        if ((data->set).connect_only == true) {
          Curl_conncontrol(pcVar14,0);
          mstate(data,CURLM_STATE_DONE);
          status = CURLE_OK;
          iVar21 = -1;
LAB_005805e7:
          bVar22 = false;
          ppcVar20 = local_80;
        }
        else {
          p_Var5 = pcVar14->handler->do_it;
          if (p_Var5 == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
LAB_00580712:
            ppcVar20 = local_80;
            if (dophase_done == false) {
              if (((data->set).wildcardmatch == true) &&
                 (((data->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE)) {
                multi_done(local_80,CURLE_OK,false);
                CVar19 = CURLM_STATE_DONE;
                goto LAB_0057fe7e;
              }
              CVar19 = CURLM_STATE_DOING;
            }
            else {
              if (((*local_80)->bits).do_more != true) {
                CVar19 = CURLM_STATE_DO_DONE;
                goto LAB_00580782;
              }
              CVar19 = CURLM_STATE_DO_MORE;
            }
LAB_0058076c:
            mstate(data,CVar19);
            goto LAB_00580772;
          }
          pCVar6 = pcVar14->data;
          status = (*p_Var5)(pcVar14,&dophase_done);
          if (status == CURLE_SEND_ERROR) {
            if (((pcVar14->bits).reuse == true) && (pCVar6->multi == (Curl_multi *)0x0)) {
              pcVar14 = *local_80;
              pCVar6 = pcVar14->data;
              newurl = (char *)pcVar14;
              Curl_infof(pCVar6,"Re-used connection seems dead, get a new one\n");
              Curl_conncontrol(pcVar14,1);
              status = multi_done((connectdata **)&newurl,CURLE_OK,false);
              *local_80 = (connectdata *)0x0;
              if ((status == CURLE_SEND_ERROR) || (status == CURLE_OK)) {
                local_6d = true;
                status = Curl_connect(pCVar6,local_80,&async_1,&local_6d);
                if ((status == CURLE_OK) && (status = CURLE_COULDNT_RESOLVE_HOST, async_1 != true))
                {
                  pcVar14 = *local_80;
                  status = (*pcVar14->handler->do_it)(pcVar14,&dophase_done);
                  goto LAB_00580628;
                }
              }
              goto LAB_00580632;
            }
LAB_00580640:
            ppcVar20 = local_80;
            status = CURLE_SEND_ERROR;
            if (((*local_80)->bits).reuse == true) {
              newurl = (char *)0x0;
              CVar11 = Curl_retry_request(*local_80,&newurl);
              pcVar3 = newurl;
              CVar9 = CVar11;
              if (CVar11 == CURLE_OK) {
                CVar9 = CURLE_SEND_ERROR;
              }
              Curl_posttransfer(data);
              iVar21 = 0;
              status = multi_done(ppcVar20,CVar9,false);
              ppcVar20 = local_80;
              bVar22 = CVar11 != CURLE_OK;
              if ((bVar22) || (pcVar3 == (char *)0x0)) {
                bVar22 = true;
                iVar21 = 0;
                status = CVar9;
              }
              else if (((status == CURLE_SEND_ERROR) || (status == CURLE_OK)) &&
                      (status = Curl_follow(data,newurl,FOLLOW_RETRY), status == CURLE_OK)) {
                mstate(data,CURLM_STATE_CONNECT);
                goto LAB_005808c4;
              }
              goto LAB_005808ca;
            }
          }
          else {
LAB_00580628:
            if (status == CURLE_OK) {
              if (dophase_done == true) {
                do_complete(pcVar14);
              }
              goto LAB_00580712;
            }
LAB_00580632:
            if (status == CURLE_SEND_ERROR) goto LAB_00580640;
          }
          ppcVar20 = local_80;
          Curl_posttransfer(data);
          bVar22 = true;
          iVar21 = 0;
          if (data->easy_conn != (connectdata *)0x0) {
            iVar21 = 0;
            multi_done(ppcVar20,status,false);
          }
        }
        break;
      case CURLM_STATE_DOING:
        status = Curl_protocol_doing(*ppcVar20,&dophase_done);
        if (status != CURLE_OK) {
LAB_0057ff4a:
          Curl_posttransfer(data);
          _Var8 = false;
          goto LAB_0057ff5e;
        }
        bVar22 = false;
        status = CURLE_OK;
        iVar21 = 0;
        if (dophase_done == true) {
          bVar1 = (data->easy_conn->bits).do_more;
          iVar21 = 0xc;
          goto LAB_005803a7;
        }
        break;
      case CURLM_STATE_DO_MORE:
        pcVar14 = *ppcVar20;
        control = 0;
        p_Var4 = pcVar14->handler->do_more;
        if (p_Var4 != (Curl_do_more_func)0x0) {
          status = (*p_Var4)(pcVar14,&control);
          if (status != CURLE_OK) goto LAB_0057ff4a;
          if (control == 1) {
            do_complete(pcVar14);
          }
          if (control != 0) {
            CVar19 = (uint)(control == 1) * 2 + CURLM_STATE_DOING;
            goto LAB_00580782;
          }
        }
LAB_00580772:
        bVar22 = false;
        status = CURLE_OK;
        goto LAB_00580777;
      case CURLM_STATE_DO_DONE:
        Curl_move_handle_from_send_to_recv_pipe(data,data->easy_conn);
        Curl_multi_process_pending_handles(multi);
        if ((data->easy_conn->sockfd == -1) && (data->easy_conn->writesockfd == -1)) {
          CVar19 = CURLM_STATE_DONE;
        }
        else {
          CVar19 = CURLM_STATE_WAITPERFORM;
        }
        goto LAB_0058004e;
      case CURLM_STATE_WAITPERFORM:
        _Var8 = Curl_pipeline_checkget_read(data,data->easy_conn);
        bVar22 = false;
        if (_Var8) {
          CVar19 = CURLM_STATE_PERFORM;
          goto LAB_0058004e;
        }
        goto LAB_00580777;
      case CURLM_STATE_PERFORM:
        newurl = (char *)0x0;
        async_1 = false;
        lVar17 = (data->set).max_send_speed;
        if (lVar17 < 1) {
          lVar17 = 0;
        }
        else {
          now_00.tv_usec = now_local.tv_usec;
          now_00.tv_sec = now_local.tv_sec;
          lVar17 = Curl_pgrsLimitWaitTime
                             ((data->progress).uploaded,(data->progress).ul_limit_size,lVar17,
                              (data->progress).ul_limit_start,now_00);
        }
        lVar18 = (data->set).max_recv_speed;
        if (lVar18 < 1) {
          lVar18 = 0;
        }
        else {
          now_01.tv_usec = now_local.tv_usec;
          now_01.tv_sec = now_local.tv_sec;
          lVar18 = Curl_pgrsLimitWaitTime
                             ((data->progress).downloaded,(data->progress).dl_limit_size,lVar18,
                              (data->progress).dl_limit_start,now_01);
        }
        if ((0 < lVar17) || (0 < lVar18)) {
          mstate(data,CURLM_STATE_TOOFAST);
          if (lVar17 < lVar18) {
            lVar17 = lVar18;
          }
          Curl_expire(data,lVar17,EXPIRE_TOOFAST);
LAB_005805e4:
          iVar21 = 0;
          goto LAB_005805e7;
        }
        status = Curl_readwrite(data->easy_conn,data,&done,&async_1);
        uVar10 = (data->req).keepon;
        if ((uVar10 & 1) == 0) {
          Curl_pipeline_leave_read(data->easy_conn);
          uVar10 = (data->req).keepon;
        }
        ppcVar20 = local_80;
        if ((uVar10 & 2) == 0) {
          Curl_pipeline_leave_write(*local_80);
        }
        if ((((status == CURLE_RECV_ERROR | done) == 1) &&
            (CVar9 = Curl_retry_request(*ppcVar20,&newurl), CVar9 == CURLE_OK)) &&
           (newurl != (char *)0x0)) {
          done = true;
          status = CURLE_UNSUPPORTED_PROTOCOL;
LAB_00580415:
          Curl_posttransfer(data);
          Curl_removeHandleFromPipeline(data,&data->easy_conn->recv_pipe);
          pcVar7 = (data->easy_conn->recv_pipe).head;
          if (pcVar7 != (curl_llist_element *)0x0) {
            Curl_expire((Curl_easy *)pcVar7->ptr,0,EXPIRE_RUN_NOW);
          }
          Curl_multi_process_pending_handles(multi);
          if ((~(byte)status & (data->req).newurl == (char *)0x0) == 0) {
            type = FOLLOW_RETRY;
            if ((byte)status == 0) {
              (*Curl_cfree)(newurl);
              newurl = (data->req).newurl;
              (data->req).newurl = (char *)0x0;
              type = FOLLOW_REDIR;
            }
            iVar21 = 0;
            status = multi_done(ppcVar20,CURLE_OK,false);
            if (status != CURLE_OK) goto LAB_00580515;
            status = Curl_follow(data,newurl,type);
            if (status != CURLE_OK) goto LAB_00580325;
            mstate(data,CURLM_STATE_CONNECT);
            bVar22 = false;
LAB_005808c4:
            status = CURLE_OK;
          }
          else {
            if ((data->req).location == (char *)0x0) {
              bVar22 = false;
              status = CURLE_OK;
            }
            else {
              (*Curl_cfree)(newurl);
              newurl = (data->req).location;
              (data->req).location = (char *)0x0;
              status = Curl_follow(data,newurl,FOLLOW_FAKE);
              bVar22 = status != CURLE_OK;
            }
            mstate(data,CURLM_STATE_DONE);
          }
          iVar21 = -1;
        }
        else if (status == CURLE_OK) {
          status = CURLE_OK;
          if ((done & 1U) != 0) goto LAB_00580415;
          iVar21 = -(uint)async_1;
LAB_00580515:
          bVar22 = false;
        }
        else {
          if ((status != CURLE_HTTP2_STREAM) && (((*ppcVar20)->handler->flags & 2) == 0)) {
            Curl_conncontrol(*ppcVar20,2);
          }
          Curl_posttransfer(data);
          multi_done(ppcVar20,status,true);
LAB_00580325:
          bVar22 = false;
          iVar21 = 0;
        }
LAB_005808ca:
        (*Curl_cfree)(newurl);
        break;
      case CURLM_STATE_TOOFAST:
        iVar12 = Curl_pgrsUpdate(*ppcVar20);
        bVar22 = false;
        status = CURLE_ABORTED_BY_CALLBACK;
        iVar21 = 0;
        if (iVar12 == 0) {
          now_04.tv_usec = now_local.tv_usec;
          now_04.tv_sec = now_local.tv_sec;
          status = Curl_speedcheck(data,now_04);
          if (status == CURLE_OK) {
            lVar17 = (data->set).max_send_speed;
            if (lVar17 < 1) {
              lVar17 = 0;
            }
            else {
              now_02.tv_usec = now_local.tv_usec;
              now_02.tv_sec = now_local.tv_sec;
              lVar17 = Curl_pgrsLimitWaitTime
                                 ((data->progress).uploaded,(data->progress).ul_limit_size,lVar17,
                                  (data->progress).ul_limit_start,now_02);
            }
            lVar18 = (data->set).max_recv_speed;
            if (lVar18 < 1) {
              lVar18 = 0;
            }
            else {
              now_03.tv_usec = now_local.tv_usec;
              now_03.tv_sec = now_local.tv_sec;
              lVar18 = Curl_pgrsLimitWaitTime
                                 ((data->progress).downloaded,(data->progress).dl_limit_size,lVar18,
                                  (data->progress).dl_limit_start,now_03);
            }
            if ((lVar17 < 1) && (lVar18 < 1)) {
              mstate(data,CURLM_STATE_PERFORM);
            }
            else {
              if (lVar17 < lVar18) {
                lVar17 = lVar18;
              }
              Curl_expire(data,lVar17,EXPIRE_TOOFAST);
            }
            status = CURLE_OK;
            goto LAB_005805e4;
          }
          goto LAB_00580186;
        }
        break;
      case CURLM_STATE_DONE:
        if (*ppcVar20 != (connectdata *)0x0) {
          Curl_removeHandleFromPipeline(data,&(*ppcVar20)->recv_pipe);
          Curl_multi_process_pending_handles(multi);
          CVar9 = multi_done(ppcVar20,status,false);
          if (status == CURLE_OK) {
            status = CVar9;
          }
          if (data->easy_conn != (connectdata *)0x0) {
            *ppcVar20 = (connectdata *)0x0;
          }
        }
        if (((data->set).wildcardmatch == true) && ((data->wildcard).state != CURLWC_DONE)) {
          mstate(data,CURLM_STATE_INIT);
          goto LAB_0058078c;
        }
        CVar19 = CURLM_STATE_COMPLETED;
LAB_0058004e:
        mstate(data,CVar19);
LAB_0058078c:
        bVar22 = false;
        iVar21 = -1;
        break;
      case CURLM_STATE_COMPLETED:
        data->easy_conn = (connectdata *)0x0;
        Curl_expire_clear(data);
LAB_00580186:
        bVar22 = false;
LAB_00580777:
        iVar21 = 0;
        break;
      case CURLM_STATE_MSGSENT:
        goto switchD_0057fb4f_caseD_12;
      default:
        return CURLM_INTERNAL_ERROR;
      }
      CVar19 = data->mstate;
      if (CVar19 < CURLM_STATE_COMPLETED) {
        if (status == CURLE_OK) {
          status = CURLE_OK;
          if ((*ppcVar20 != (connectdata *)0x0) &&
             (iVar12 = Curl_pgrsUpdate(*ppcVar20), iVar12 != 0)) {
            Curl_conncontrol(data->easy_conn,2);
            CVar19 = CURLM_STATE_COMPLETED - (data->mstate < CURLM_STATE_DONE);
            status = CURLE_ABORTED_BY_CALLBACK;
            iVar21 = -1;
            goto LAB_00580854;
          }
        }
        else {
          (data->state).pipe_broke = false;
          Curl_multi_process_pending_handles(multi);
          if (data->easy_conn == (connectdata *)0x0) {
            if (data->mstate == CURLM_STATE_CONNECT) {
              Curl_posttransfer(data);
            }
          }
          else {
            Curl_pipeline_leave_write(data->easy_conn);
            Curl_pipeline_leave_read(data->easy_conn);
            Curl_removeHandleFromPipeline(data,&data->easy_conn->send_pipe);
            Curl_removeHandleFromPipeline(data,&data->easy_conn->recv_pipe);
            if (bVar22) {
              Curl_disconnect(*ppcVar20,status == CURLE_OPERATION_TIMEDOUT);
              *ppcVar20 = (connectdata *)0x0;
            }
          }
          CVar19 = CURLM_STATE_COMPLETED;
LAB_00580854:
          mstate(data,CVar19);
        }
        CVar19 = data->mstate;
      }
      if (CVar19 == CURLM_STATE_COMPLETED) {
        (data->msg).extmsg.msg = CURLMSG_DONE;
        (data->msg).extmsg.easy_handle = data;
        (data->msg).extmsg.data.result = status;
        Curl_llist_insert_next(&multi->msglist,(multi->msglist).tail,&data->msg,&(data->msg).list);
        mstate(data,CURLM_STATE_MSGSENT);
      }
      else {
LAB_00580895:
        if (iVar21 == -1) goto LAB_0057fa72;
      }
    } while (multi->recheckstate != false);
switchD_0057fb4f_caseD_12:
    data->result = status;
    CVar13 = CURLM_OK;
  }
  return CVar13;
}

Assistant:

static CURLMcode multi_runsingle(struct Curl_multi *multi,
                                 struct timeval now,
                                 struct Curl_easy *data)
{
  struct Curl_message *msg = NULL;
  bool connected;
  bool async;
  bool protocol_connect = FALSE;
  bool dophase_done = FALSE;
  bool done = FALSE;
  CURLMcode rc;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k;
  time_t timeout_ms;
  time_t recv_timeout_ms;
  time_t send_timeout_ms;
  int control;

  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  do {
    /* A "stream" here is a logical stream if the protocol can handle that
       (HTTP/2), or the full connection for older protocols */
    bool stream_error = FALSE;
    rc = CURLM_OK;

    /* Handle the case when the pipe breaks, i.e., the connection
       we're using gets cleaned up and we're left with nothing. */
    if(data->state.pipe_broke) {
      infof(data, "Pipe broke: handle %p, url = %s\n",
            (void *)data, data->state.path);

      if(data->mstate < CURLM_STATE_COMPLETED) {
        /* Head back to the CONNECT state */
        multistate(data, CURLM_STATE_CONNECT);
        rc = CURLM_CALL_MULTI_PERFORM;
        result = CURLE_OK;
      }

      data->state.pipe_broke = FALSE;
      data->easy_conn = NULL;
      continue;
    }

    if(!data->easy_conn &&
       data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_DONE) {
      /* In all these states, the code will blindly access 'data->easy_conn'
         so this is precaution that it isn't NULL. And it silences static
         analyzers. */
      failf(data, "In state %d with no easy_conn, bail out!\n", data->mstate);
      return CURLM_INTERNAL_ERROR;
    }

    if(multi_ischanged(multi, TRUE)) {
      DEBUGF(infof(data, "multi changed, check CONNECT_PEND queue!\n"));
      Curl_multi_process_pending_handles(multi);
    }

    if(data->easy_conn && data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_COMPLETED)
      /* Make sure we set the connection's current owner */
      data->easy_conn->data = data;

    if(data->easy_conn &&
       (data->mstate >= CURLM_STATE_CONNECT) &&
       (data->mstate < CURLM_STATE_COMPLETED)) {
      /* we need to wait for the connect state as only then is the start time
         stored, but we must not check already completed handles */

      timeout_ms = Curl_timeleft(data, &now,
                                 (data->mstate <= CURLM_STATE_WAITDO)?
                                 TRUE:FALSE);

      if(timeout_ms < 0) {
        /* Handle timed out */
        if(data->mstate == CURLM_STATE_WAITRESOLVE)
          failf(data, "Resolving timed out after %ld milliseconds",
                Curl_tvdiff(now, data->progress.t_startsingle));
        else if(data->mstate == CURLM_STATE_WAITCONNECT)
          failf(data, "Connection timed out after %ld milliseconds",
                Curl_tvdiff(now, data->progress.t_startsingle));
        else {
          k = &data->req;
          if(k->size != -1) {
            failf(data, "Operation timed out after %ld milliseconds with %"
                  CURL_FORMAT_CURL_OFF_T " out of %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_tvdiff(now, data->progress.t_startsingle),
                  k->bytecount, k->size);
          }
          else {
            failf(data, "Operation timed out after %ld milliseconds with %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_tvdiff(now, data->progress.t_startsingle),
                  k->bytecount);
          }
        }

        /* Force connection closed if the connection has indeed been used */
        if(data->mstate > CURLM_STATE_DO) {
          streamclose(data->easy_conn, "Disconnected with pending data");
          stream_error = TRUE;
        }
        result = CURLE_OPERATION_TIMEDOUT;
        (void)multi_done(&data->easy_conn, result, TRUE);
        /* Skip the statemachine and go directly to error handling section. */
        goto statemachine_end;
      }
    }

    switch(data->mstate) {
    case CURLM_STATE_INIT:
      /* init this transfer. */
      result=Curl_pretransfer(data);

      if(!result) {
        /* after init, go CONNECT */
        multistate(data, CURLM_STATE_CONNECT);
        Curl_pgrsTime(data, TIMER_STARTOP);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_CONNECT_PEND:
      /* We will stay here until there is a connection available. Then
         we try again in the CURLM_STATE_CONNECT state. */
      break;

    case CURLM_STATE_CONNECT:
      /* Connect. We want to get a connection identifier filled in. */
      Curl_pgrsTime(data, TIMER_STARTSINGLE);
      result = Curl_connect(data, &data->easy_conn,
                            &async, &protocol_connect);
      if(CURLE_NO_CONNECTION_AVAILABLE == result) {
        /* There was no connection available. We will go to the pending
           state and wait for an available connection. */
        multistate(data, CURLM_STATE_CONNECT_PEND);

        /* add this handle to the list of connect-pending handles */
        Curl_llist_insert_next(&multi->pending, multi->pending.tail, data,
                               &data->connect_queue);
        result = CURLE_OK;
        break;
      }

      if(!result) {
        /* Add this handle to the send or pend pipeline */
        result = Curl_add_handle_to_pipeline(data, data->easy_conn);
        if(result)
          stream_error = TRUE;
        else {
          if(async)
            /* We're now waiting for an asynchronous name lookup */
            multistate(data, CURLM_STATE_WAITRESOLVE);
          else {
            /* after the connect has been sent off, go WAITCONNECT unless the
               protocol connect is already done and we can go directly to
               WAITDO or DO! */
            rc = CURLM_CALL_MULTI_PERFORM;

            if(protocol_connect)
              multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                         CURLM_STATE_WAITDO:CURLM_STATE_DO);
            else {
#ifndef CURL_DISABLE_HTTP
              if(data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
                multistate(data, CURLM_STATE_WAITPROXYCONNECT);
              else
#endif
                multistate(data, CURLM_STATE_WAITCONNECT);
            }
          }
        }
      }
      break;

    case CURLM_STATE_WAITRESOLVE:
      /* awaiting an asynch name resolve to complete */
    {
      struct Curl_dns_entry *dns = NULL;
      struct connectdata *conn = data->easy_conn;
      const char *hostname;

      if(conn->bits.httpproxy)
        hostname = conn->http_proxy.host.name;
      else if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
      else
        hostname = conn->host.name;

      /* check if we have the name resolved by now */
      dns = Curl_fetch_addr(conn, hostname, (int)conn->port);

      if(dns) {
#ifdef CURLRES_ASYNCH
        conn->async.dns = dns;
        conn->async.done = TRUE;
#endif
        result = CURLE_OK;
        infof(data, "Hostname '%s' was found in DNS cache\n", hostname);
      }

      if(!dns)
        result = Curl_resolver_is_resolved(data->easy_conn, &dns);

      /* Update sockets here, because the socket(s) may have been
         closed and the application thus needs to be told, even if it
         is likely that the same socket(s) will again be used further
         down.  If the name has not yet been resolved, it is likely
         that new sockets have been opened in an attempt to contact
         another resolver. */
      singlesocket(multi, data);

      if(dns) {
        /* Perform the next step in the connection phase, and then move on
           to the WAITCONNECT state */
        result = Curl_async_resolved(data->easy_conn, &protocol_connect);

        if(result)
          /* if Curl_async_resolved() returns failure, the connection struct
             is already freed and gone */
          data->easy_conn = NULL;           /* no more connection */
        else {
          /* call again please so that we get the next socket setup */
          rc = CURLM_CALL_MULTI_PERFORM;
          if(protocol_connect)
            multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                       CURLM_STATE_WAITDO:CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }

      if(result) {
        /* failure detected */
        stream_error = TRUE;
        break;
      }
    }
    break;

#ifndef CURL_DISABLE_HTTP
    case CURLM_STATE_WAITPROXYCONNECT:
      /* this is HTTP-specific, but sending CONNECT to a proxy is HTTP... */
      result = Curl_http_connect(data->easy_conn, &protocol_connect);

      if(data->easy_conn->bits.proxy_connect_closed) {
        rc = CURLM_CALL_MULTI_PERFORM;
        /* connect back to proxy again */
        result = CURLE_OK;
        multi_done(&data->easy_conn, CURLE_OK, FALSE);
        multistate(data, CURLM_STATE_CONNECT);
      }
      else if(!result) {
        if((data->easy_conn->http_proxy.proxytype != CURLPROXY_HTTPS ||
           data->easy_conn->bits.proxy_ssl_connected[FIRSTSOCKET]) &&
           (data->easy_conn->tunnel_state[FIRSTSOCKET] != TUNNEL_CONNECT)) {
          rc = CURLM_CALL_MULTI_PERFORM;
          /* initiate protocol connect phase */
          multistate(data, CURLM_STATE_SENDPROTOCONNECT);
        }
      }
      break;
#endif

    case CURLM_STATE_WAITCONNECT:
      /* awaiting a completion of an asynch TCP connect */
      result = Curl_is_connected(data->easy_conn, FIRSTSOCKET, &connected);
      if(connected && !result) {
#ifndef CURL_DISABLE_HTTP
        if((data->easy_conn->http_proxy.proxytype == CURLPROXY_HTTPS &&
            !data->easy_conn->bits.proxy_ssl_connected[FIRSTSOCKET]) ||
            (data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)) {
          multistate(data, CURLM_STATE_WAITPROXYCONNECT);
          break;
        }
#endif
        rc = CURLM_CALL_MULTI_PERFORM;
        multistate(data, data->easy_conn->bits.tunnel_proxy?
                   CURLM_STATE_WAITPROXYCONNECT:
                   CURLM_STATE_SENDPROTOCONNECT);
      }
      else if(result) {
        /* failure detected */
        /* Just break, the cleaning up is handled all in one place */
        stream_error = TRUE;
        break;
      }
      break;

    case CURLM_STATE_SENDPROTOCONNECT:
      result = Curl_protocol_connect(data->easy_conn, &protocol_connect);
      if(!protocol_connect)
        /* switch to waiting state */
        multistate(data, CURLM_STATE_PROTOCONNECT);
      else if(!result) {
        /* protocol connect has completed, go WAITDO or DO */
        multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                   CURLM_STATE_WAITDO:CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_PROTOCONNECT:
      /* protocol-specific connect phase */
      result = Curl_protocol_connecting(data->easy_conn, &protocol_connect);
      if(!result && protocol_connect) {
        /* after the connect has completed, go WAITDO or DO */
        multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                   CURLM_STATE_WAITDO:CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_WAITDO:
      /* Wait for our turn to DO when we're pipelining requests */
      if(Curl_pipeline_checkget_write(data, data->easy_conn)) {
        /* Grabbed the channel */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_DO:
      if(data->set.connect_only) {
        /* keep connection open for application to use the socket */
        connkeep(data->easy_conn, "CONNECT_ONLY");
        multistate(data, CURLM_STATE_DONE);
        result = CURLE_OK;
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else {
        /* Perform the protocol's DO action */
        result = multi_do(&data->easy_conn, &dophase_done);

        /* When multi_do() returns failure, data->easy_conn might be NULL! */

        if(!result) {
          if(!dophase_done) {
            /* some steps needed for wildcard matching */
            if(data->set.wildcardmatch) {
              struct WildcardData *wc = &data->wildcard;
              if(wc->state == CURLWC_DONE || wc->state == CURLWC_SKIP) {
                /* skip some states if it is important */
                multi_done(&data->easy_conn, CURLE_OK, FALSE);
                multistate(data, CURLM_STATE_DONE);
                rc = CURLM_CALL_MULTI_PERFORM;
                break;
              }
            }
            /* DO was not completed in one function call, we must continue
               DOING... */
            multistate(data, CURLM_STATE_DOING);
            rc = CURLM_OK;
          }

          /* after DO, go DO_DONE... or DO_MORE */
          else if(data->easy_conn->bits.do_more) {
            /* we're supposed to do more, but we need to sit down, relax
               and wait a little while first */
            multistate(data, CURLM_STATE_DO_MORE);
            rc = CURLM_OK;
          }
          else {
            /* we're done with the DO, now DO_DONE */
            multistate(data, CURLM_STATE_DO_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
        else if((CURLE_SEND_ERROR == result) &&
                data->easy_conn->bits.reuse) {
          /*
           * In this situation, a connection that we were trying to use
           * may have unexpectedly died.  If possible, send the connection
           * back to the CONNECT phase so we can try again.
           */
          char *newurl = NULL;
          followtype follow=FOLLOW_NONE;
          CURLcode drc;
          bool retry = FALSE;

          drc = Curl_retry_request(data->easy_conn, &newurl);
          if(drc) {
            /* a failure here pretty much implies an out of memory */
            result = drc;
            stream_error = TRUE;
          }
          else
            retry = (newurl)?TRUE:FALSE;

          Curl_posttransfer(data);
          drc = multi_done(&data->easy_conn, result, FALSE);

          /* When set to retry the connection, we must to go back to
           * the CONNECT state */
          if(retry) {
            if(!drc || (drc == CURLE_SEND_ERROR)) {
              follow = FOLLOW_RETRY;
              drc = Curl_follow(data, newurl, follow);
              if(!drc) {
                multistate(data, CURLM_STATE_CONNECT);
                rc = CURLM_CALL_MULTI_PERFORM;
                result = CURLE_OK;
              }
              else {
                /* Follow failed */
                result = drc;
              }
            }
            else {
              /* done didn't return OK or SEND_ERROR */
              result = drc;
            }
          }
          else {
            /* Have error handler disconnect conn if we can't retry */
            stream_error = TRUE;
          }
          free(newurl);
        }
        else {
          /* failure detected */
          Curl_posttransfer(data);
          if(data->easy_conn)
            multi_done(&data->easy_conn, result, FALSE);
          stream_error = TRUE;
        }
      }
      break;

    case CURLM_STATE_DOING:
      /* we continue DOING until the DO phase is complete */
      result = Curl_protocol_doing(data->easy_conn,
                                   &dophase_done);
      if(!result) {
        if(dophase_done) {
          /* after DO, go DO_DONE or DO_MORE */
          multistate(data, data->easy_conn->bits.do_more?
                     CURLM_STATE_DO_MORE:
                     CURLM_STATE_DO_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        } /* dophase_done */
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_MORE:
      /*
       * When we are connected, DO MORE and then go DO_DONE
       */
      result = multi_do_more(data->easy_conn, &control);

      /* No need to remove this handle from the send pipeline here since that
         is done in multi_done() */
      if(!result) {
        if(control) {
          /* if positive, advance to DO_DONE
             if negative, go back to DOING */
          multistate(data, control==1?
                     CURLM_STATE_DO_DONE:
                     CURLM_STATE_DOING);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
        else
          /* stay in DO_MORE */
          rc = CURLM_OK;
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_DONE:
      /* Move ourselves from the send to recv pipeline */
      Curl_move_handle_from_send_to_recv_pipe(data, data->easy_conn);
      /* Check if we can move pending requests to send pipe */
      Curl_multi_process_pending_handles(multi);

      /* Only perform the transfer if there's a good socket to work with.
         Having both BAD is a signal to skip immediately to DONE */
      if((data->easy_conn->sockfd != CURL_SOCKET_BAD) ||
         (data->easy_conn->writesockfd != CURL_SOCKET_BAD))
        multistate(data, CURLM_STATE_WAITPERFORM);
      else
        multistate(data, CURLM_STATE_DONE);
      rc = CURLM_CALL_MULTI_PERFORM;
      break;

    case CURLM_STATE_WAITPERFORM:
      /* Wait for our turn to PERFORM */
      if(Curl_pipeline_checkget_read(data, data->easy_conn)) {
        /* Grabbed the channel */
        multistate(data, CURLM_STATE_PERFORM);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_TOOFAST: /* limit-rate exceeded in either direction */
      /* if both rates are within spec, resume transfer */
      if(Curl_pgrsUpdate(data->easy_conn))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, now);

      if(!result) {
        send_timeout_ms = 0;
        if(data->set.max_send_speed > 0)
          send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                data->progress.ul_limit_size,
                                data->set.max_send_speed,
                                data->progress.ul_limit_start,
                                now);

        recv_timeout_ms = 0;
        if(data->set.max_recv_speed > 0)
          recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                data->progress.dl_limit_size,
                                data->set.max_recv_speed,
                                data->progress.dl_limit_start,
                                now);

        if(send_timeout_ms <= 0 && recv_timeout_ms <= 0)
          multistate(data, CURLM_STATE_PERFORM);
        else if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
      }
      break;

    case CURLM_STATE_PERFORM:
    {
      char *newurl = NULL;
      bool retry = FALSE;
      bool comeback = FALSE;

      /* check if over send speed */
      send_timeout_ms = 0;
      if(data->set.max_send_speed > 0)
        send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                                 data->progress.ul_limit_size,
                                                 data->set.max_send_speed,
                                                 data->progress.ul_limit_start,
                                                 now);

      /* check if over recv speed */
      recv_timeout_ms = 0;
      if(data->set.max_recv_speed > 0)
        recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                                 data->progress.dl_limit_size,
                                                 data->set.max_recv_speed,
                                                 data->progress.dl_limit_start,
                                                 now);

      if(send_timeout_ms > 0 || recv_timeout_ms > 0) {
        multistate(data, CURLM_STATE_TOOFAST);
        if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
        break;
      }

      /* read/write data if it is ready to do so */
      result = Curl_readwrite(data->easy_conn, data, &done, &comeback);

      k = &data->req;

      if(!(k->keepon & KEEP_RECV))
        /* We're done receiving */
        Curl_pipeline_leave_read(data->easy_conn);

      if(!(k->keepon & KEEP_SEND))
        /* We're done sending */
        Curl_pipeline_leave_write(data->easy_conn);

      if(done || (result == CURLE_RECV_ERROR)) {
        /* If CURLE_RECV_ERROR happens early enough, we assume it was a race
         * condition and the server closed the re-used connection exactly when
         * we wanted to use it, so figure out if that is indeed the case.
         */
        CURLcode ret = Curl_retry_request(data->easy_conn, &newurl);
        if(!ret)
          retry = (newurl)?TRUE:FALSE;

        if(retry) {
          /* if we are to retry, set the result to OK and consider the
             request as done */
          result = CURLE_OK;
          done = TRUE;
        }
      }

      if(result) {
        /*
         * The transfer phase returned error, we mark the connection to get
         * closed to prevent being re-used. This is because we can't possibly
         * know if the connection is in a good shape or not now.  Unless it is
         * a protocol which uses two "channels" like FTP, as then the error
         * happened in the data connection.
         */

        if(!(data->easy_conn->handler->flags & PROTOPT_DUAL) &&
           result != CURLE_HTTP2_STREAM)
          streamclose(data->easy_conn, "Transfer returned error");

        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
      }
      else if(done) {
        followtype follow=FOLLOW_NONE;

        /* call this even if the readwrite function returned error */
        Curl_posttransfer(data);

        /* we're no longer receiving */
        Curl_removeHandleFromPipeline(data, &data->easy_conn->recv_pipe);

        /* expire the new receiving pipeline head */
        if(data->easy_conn->recv_pipe.head)
          Curl_expire(data->easy_conn->recv_pipe.head->ptr, 0, EXPIRE_RUN_NOW);

        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        /* When we follow redirects or is set to retry the connection, we must
           to go back to the CONNECT state */
        if(data->req.newurl || retry) {
          if(!retry) {
            /* if the URL is a follow-location and not just a retried request
               then figure out the URL here */
            free(newurl);
            newurl = data->req.newurl;
            data->req.newurl = NULL;
            follow = FOLLOW_REDIR;
          }
          else
            follow = FOLLOW_RETRY;
          result = multi_done(&data->easy_conn, CURLE_OK, FALSE);
          if(!result) {
            result = Curl_follow(data, newurl, follow);
            if(!result) {
              multistate(data, CURLM_STATE_CONNECT);
              rc = CURLM_CALL_MULTI_PERFORM;
            }
          }
        }
        else {
          /* after the transfer is done, go DONE */

          /* but first check to see if we got a location info even though we're
             not following redirects */
          if(data->req.location) {
            free(newurl);
            newurl = data->req.location;
            data->req.location = NULL;
            result = Curl_follow(data, newurl, FOLLOW_FAKE);
            if(result)
              stream_error = TRUE;
          }

          multistate(data, CURLM_STATE_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
      }
      else if(comeback)
        rc = CURLM_CALL_MULTI_PERFORM;

      free(newurl);
      break;
    }

    case CURLM_STATE_DONE:
      /* this state is highly transient, so run another loop after this */
      rc = CURLM_CALL_MULTI_PERFORM;

      if(data->easy_conn) {
        CURLcode res;

        /* Remove ourselves from the receive pipeline, if we are there. */
        Curl_removeHandleFromPipeline(data, &data->easy_conn->recv_pipe);
        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        /* post-transfer command */
        res = multi_done(&data->easy_conn, result, FALSE);

        /* allow a previously set error code take precedence */
        if(!result)
          result = res;

        /*
         * If there are other handles on the pipeline, multi_done won't set
         * easy_conn to NULL.  In such a case, curl_multi_remove_handle() can
         * access free'd data, if the connection is free'd and the handle
         * removed before we perform the processing in CURLM_STATE_COMPLETED
         */
        if(data->easy_conn)
          data->easy_conn = NULL;
      }

      if(data->set.wildcardmatch) {
        if(data->wildcard.state != CURLWC_DONE) {
          /* if a wildcard is set and we are not ending -> lets start again
             with CURLM_STATE_INIT */
          multistate(data, CURLM_STATE_INIT);
          break;
        }
      }

      /* after we have DONE what we're supposed to do, go COMPLETED, and
         it doesn't matter what the multi_done() returned! */
      multistate(data, CURLM_STATE_COMPLETED);
      break;

    case CURLM_STATE_COMPLETED:
      /* this is a completed transfer, it is likely to still be connected */

      /* This node should be delinked from the list now and we should post
         an information message that we are complete. */

      /* Important: reset the conn pointer so that we don't point to memory
         that could be freed anytime */
      data->easy_conn = NULL;

      Curl_expire_clear(data); /* stop all timers */
      break;

    case CURLM_STATE_MSGSENT:
      data->result = result;
      return CURLM_OK; /* do nothing */

    default:
      return CURLM_INTERNAL_ERROR;
    }
    statemachine_end:

    if(data->mstate < CURLM_STATE_COMPLETED) {
      if(result) {
        /*
         * If an error was returned, and we aren't in completed state now,
         * then we go to completed and consider this transfer aborted.
         */

        /* NOTE: no attempt to disconnect connections must be made
           in the case blocks above - cleanup happens only here */

        data->state.pipe_broke = FALSE;

        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        if(data->easy_conn) {
          /* if this has a connection, unsubscribe from the pipelines */
          Curl_pipeline_leave_write(data->easy_conn);
          Curl_pipeline_leave_read(data->easy_conn);
          Curl_removeHandleFromPipeline(data, &data->easy_conn->send_pipe);
          Curl_removeHandleFromPipeline(data, &data->easy_conn->recv_pipe);

          if(stream_error) {
            /* Don't attempt to send data over a connection that timed out */
            bool dead_connection = result == CURLE_OPERATION_TIMEDOUT;
            /* disconnect properly */
            Curl_disconnect(data->easy_conn, dead_connection);

            /* This is where we make sure that the easy_conn pointer is reset.
               We don't have to do this in every case block above where a
               failure is detected */
            data->easy_conn = NULL;
          }
        }
        else if(data->mstate == CURLM_STATE_CONNECT) {
          /* Curl_connect() failed */
          (void)Curl_posttransfer(data);
        }

        multistate(data, CURLM_STATE_COMPLETED);
      }
      /* if there's still a connection to use, call the progress function */
      else if(data->easy_conn && Curl_pgrsUpdate(data->easy_conn)) {
        /* aborted due to progress callback return code must close the
           connection */
        result = CURLE_ABORTED_BY_CALLBACK;
        streamclose(data->easy_conn, "Aborted by callback");

        /* if not yet in DONE state, go there, otherwise COMPLETED */
        multistate(data, (data->mstate < CURLM_STATE_DONE)?
                   CURLM_STATE_DONE: CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
    }

    if(CURLM_STATE_COMPLETED == data->mstate) {
      /* now fill in the Curl_message with this info */
      msg = &data->msg;

      msg->extmsg.msg = CURLMSG_DONE;
      msg->extmsg.easy_handle = data;
      msg->extmsg.data.result = result;

      rc = multi_addmsg(multi, msg);

      multistate(data, CURLM_STATE_MSGSENT);
    }
  } while((rc == CURLM_CALL_MULTI_PERFORM) || multi_ischanged(multi, FALSE));

  data->result = result;


  return rc;
}